

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

string * __thiscall
CppGenerator::genRunFunction_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,bool parallelize)

{
  undefined8 *puVar1;
  bool bVar2;
  char cVar3;
  long *plVar4;
  undefined8 *puVar5;
  size_t sVar6;
  TDNode *pTVar7;
  ulong uVar8;
  long *plVar9;
  ulong uVar10;
  size_type *psVar11;
  undefined7 in_register_00000011;
  pointer puVar12;
  size_t rel;
  ulong uVar13;
  ulong uVar14;
  char cVar15;
  CppGenerator *pCVar16;
  ulong *puVar17;
  string *psVar18;
  _Bit_iterator *p_Var19;
  pointer puVar20;
  long lVar21;
  vector<bool,_std::allocator<bool>_> joinedGroups;
  string __str_3;
  string __str;
  string __str_1;
  string returnString;
  ulong *local_378;
  long local_370;
  ulong local_368;
  long lStack_360;
  CppGenerator *local_358;
  ulong *local_350;
  long local_348;
  ulong local_340;
  long lStack_338;
  ulong *local_330;
  long local_328;
  ulong local_320;
  undefined8 uStack_318;
  vector<bool,_std::allocator<bool>_> local_310;
  ulong *local_2e8;
  long local_2e0;
  ulong local_2d8;
  long lStack_2d0;
  ulong *local_2c8;
  long local_2c0;
  ulong local_2b8;
  long lStack_2b0;
  ulong *local_2a8;
  long local_2a0;
  ulong local_298;
  long lStack_290;
  undefined8 *local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  ulong *local_268;
  long local_260;
  ulong local_258;
  long lStack_250;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  ulong *local_228;
  long local_220;
  ulong local_218;
  long lStack_210;
  ulong local_208;
  ulong *local_200;
  long local_1f8;
  ulong local_1f0;
  long lStack_1e8;
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0;
  long lStack_1c8;
  ulong *local_1c0;
  long local_1b8;
  ulong local_1b0;
  long lStack_1a8;
  long *local_1a0;
  long local_198;
  long local_190;
  long lStack_188;
  ulong *local_180;
  long local_178;
  ulong local_170;
  long lStack_168;
  ulong *local_160;
  long local_158;
  ulong local_150;
  undefined8 uStack_148;
  pointer local_140;
  ulong *local_138;
  long local_130;
  ulong local_128;
  long lStack_120;
  ulong *local_118;
  long local_110;
  ulong local_108 [2];
  string *local_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  local_140 = (pointer)CONCAT44(local_140._4_4_,(int)CONCAT71(in_register_00000011,parallelize));
  local_358 = this;
  local_350 = &local_340;
  std::__cxx11::string::_M_construct((ulong)&local_350,'\x03');
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_350);
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_368 = *puVar17;
    lStack_360 = plVar4[3];
    local_378 = &local_368;
  }
  else {
    local_368 = *puVar17;
    local_378 = (ulong *)*plVar4;
  }
  local_370 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_330 = &local_320;
  std::__cxx11::string::_M_construct((ulong)&local_330,'\x03');
  uVar13 = 0xf;
  if (local_378 != &local_368) {
    uVar13 = local_368;
  }
  if (uVar13 < (ulong)(local_328 + local_370)) {
    uVar13 = 0xf;
    if (local_330 != &local_320) {
      uVar13 = local_320;
    }
    if (uVar13 < (ulong)(local_328 + local_370)) goto LAB_00224a30;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_330,0,(char *)0x0,(ulong)local_378);
  }
  else {
LAB_00224a30:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_378,(ulong)local_330);
  }
  local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish;
  puVar1 = puVar5 + 2;
  if ((_Bit_iterator *)*puVar5 == (_Bit_iterator *)puVar1) {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*puVar1;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ = puVar5[3];
  }
  else {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*puVar1;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)*puVar5;
  }
  local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_310);
  local_1a0 = &local_190;
  plVar9 = plVar4 + 2;
  if ((long *)*plVar4 == plVar9) {
    local_190 = *plVar9;
    lStack_188 = plVar4[3];
  }
  else {
    local_190 = *plVar9;
    local_1a0 = (long *)*plVar4;
  }
  local_198 = plVar4[1];
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((_Bit_iterator *)
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p !=
      &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish) {
    operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350);
  }
  local_118 = local_108;
  std::__cxx11::string::_M_construct((ulong)&local_118,'\x06');
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
  local_138 = &local_128;
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_128 = *puVar17;
    lStack_120 = plVar4[3];
  }
  else {
    local_128 = *puVar17;
    local_138 = (ulong *)*plVar4;
  }
  local_130 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_138);
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_170 = *puVar17;
    lStack_168 = plVar4[3];
    local_180 = &local_170;
  }
  else {
    local_170 = *puVar17;
    local_180 = (ulong *)*plVar4;
  }
  local_178 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,'\x06');
  uVar13 = 0xf;
  if (local_180 != &local_170) {
    uVar13 = local_170;
  }
  if (uVar13 < (ulong)(local_48 + local_178)) {
    uVar13 = 0xf;
    if (local_50 != local_40) {
      uVar13 = local_40[0];
    }
    if (uVar13 < (ulong)(local_48 + local_178)) goto LAB_00224c90;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_180);
  }
  else {
LAB_00224c90:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_50);
  }
  local_160 = &local_150;
  puVar17 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar17) {
    local_150 = *puVar17;
    uStack_148 = puVar5[3];
  }
  else {
    local_150 = *puVar17;
    local_160 = (ulong *)*puVar5;
  }
  local_158 = puVar5[1];
  *puVar5 = puVar17;
  puVar5[1] = 0;
  *(undefined1 *)puVar17 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_160);
  local_1e0 = &local_1d0;
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_1d0 = *puVar17;
    lStack_1c8 = plVar4[3];
  }
  else {
    local_1d0 = *puVar17;
    local_1e0 = (ulong *)*plVar4;
  }
  local_1d8 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,'\x06');
  uVar13 = 0xf;
  if (local_1e0 != &local_1d0) {
    uVar13 = local_1d0;
  }
  if (uVar13 < (ulong)(local_68 + local_1d8)) {
    uVar13 = 0xf;
    if (local_70 != local_60) {
      uVar13 = local_60[0];
    }
    if (uVar13 < (ulong)(local_68 + local_1d8)) goto LAB_00224deb;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_1e0);
  }
  else {
LAB_00224deb:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_70);
  }
  local_200 = &local_1f0;
  puVar17 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar17) {
    local_1f0 = *puVar17;
    lStack_1e8 = puVar5[3];
  }
  else {
    local_1f0 = *puVar17;
    local_200 = (ulong *)*puVar5;
  }
  local_1f8 = puVar5[1];
  *puVar5 = puVar17;
  puVar5[1] = 0;
  *(undefined1 *)puVar17 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_200);
  local_1c0 = &local_1b0;
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_1b0 = *puVar17;
    lStack_1a8 = plVar4[3];
  }
  else {
    local_1b0 = *puVar17;
    local_1c0 = (ulong *)*plVar4;
  }
  local_1b8 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  local_228 = &local_218;
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_218 = *puVar17;
    lStack_210 = plVar4[3];
  }
  else {
    local_218 = *puVar17;
    local_228 = (ulong *)*plVar4;
  }
  local_220 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,'\x06');
  uVar13 = 0xf;
  if (local_228 != &local_218) {
    uVar13 = local_218;
  }
  if (uVar13 < (ulong)(local_88 + local_220)) {
    uVar13 = 0xf;
    if (local_90 != local_80) {
      uVar13 = local_80[0];
    }
    if (uVar13 < (ulong)(local_88 + local_220)) goto LAB_00224fa6;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_228);
  }
  else {
LAB_00224fa6:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_90);
  }
  local_248 = &local_238;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_238 = *plVar4;
    lStack_230 = puVar5[3];
  }
  else {
    local_238 = *plVar4;
    local_248 = (long *)*puVar5;
  }
  local_240 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_248);
  local_268 = &local_258;
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_258 = *puVar17;
    lStack_250 = plVar4[3];
  }
  else {
    local_258 = *puVar17;
    local_268 = (ulong *)*plVar4;
  }
  local_260 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_268);
  local_2a8 = &local_298;
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_298 = *puVar17;
    lStack_290 = plVar4[3];
  }
  else {
    local_298 = *puVar17;
    local_2a8 = (ulong *)*plVar4;
  }
  local_2a0 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_f8 = __return_storage_ptr__;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,'\x06');
  uVar13 = 0xf;
  if (local_2a8 != &local_298) {
    uVar13 = local_298;
  }
  if (uVar13 < (ulong)(local_a8 + local_2a0)) {
    uVar13 = 0xf;
    if (local_b0 != local_a0) {
      uVar13 = local_a0[0];
    }
    if (uVar13 < (ulong)(local_a8 + local_2a0)) goto LAB_00225169;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_2a8);
  }
  else {
LAB_00225169:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_b0);
  }
  local_288 = &local_278;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_278 = *puVar1;
    uStack_270 = puVar5[3];
  }
  else {
    local_278 = *puVar1;
    local_288 = (undefined8 *)*puVar5;
  }
  local_280 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_288);
  local_2c8 = &local_2b8;
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_2b8 = *puVar17;
    lStack_2b0 = plVar4[3];
  }
  else {
    local_2b8 = *puVar17;
    local_2c8 = (ulong *)*plVar4;
  }
  local_2c0 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2c8);
  local_2e8 = &local_2d8;
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_2d8 = *puVar17;
    lStack_2d0 = plVar4[3];
  }
  else {
    local_2d8 = *puVar17;
    local_2e8 = (ulong *)*plVar4;
  }
  local_2e0 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct((ulong)&local_d0,'\x06');
  uVar13 = 0xf;
  if (local_2e8 != &local_2d8) {
    uVar13 = local_2d8;
  }
  if (uVar13 < (ulong)(local_c8 + local_2e0)) {
    uVar13 = 0xf;
    if (local_d0 != local_c0) {
      uVar13 = local_c0[0];
    }
    if (uVar13 < (ulong)(local_c8 + local_2e0)) goto LAB_00225324;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_2e8);
  }
  else {
LAB_00225324:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_d0);
  }
  puVar17 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar17) {
    local_320 = *puVar17;
    uStack_318 = puVar5[3];
    local_330 = &local_320;
  }
  else {
    local_320 = *puVar17;
    local_330 = (ulong *)*puVar5;
  }
  local_328 = puVar5[1];
  *puVar5 = puVar17;
  puVar5[1] = 0;
  *(undefined1 *)puVar17 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_330);
  local_350 = &local_340;
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_340 = *puVar17;
    lStack_338 = plVar4[3];
  }
  else {
    local_340 = *puVar17;
    local_350 = (ulong *)*plVar4;
  }
  local_348 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct((ulong)&local_f0,'\x06');
  uVar13 = 0xf;
  if (local_350 != &local_340) {
    uVar13 = local_340;
  }
  if (uVar13 < (ulong)(local_e8 + local_348)) {
    uVar13 = 0xf;
    if (local_f0 != local_e0) {
      uVar13 = local_e0[0];
    }
    if (uVar13 < (ulong)(local_e8 + local_348)) goto LAB_00225455;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_350);
  }
  else {
LAB_00225455:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_350,(ulong)local_f0);
  }
  local_378 = &local_368;
  puVar17 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar17) {
    local_368 = *puVar17;
    lStack_360 = puVar5[3];
  }
  else {
    local_368 = *puVar17;
    local_378 = (ulong *)*puVar5;
  }
  local_370 = puVar5[1];
  *puVar5 = puVar17;
  puVar5[1] = 0;
  *(undefined1 *)puVar17 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_378);
  local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish;
  plVar9 = plVar4 + 2;
  if ((_Bit_iterator *)*plVar4 == (_Bit_iterator *)plVar9) {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar9;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ = plVar4[3];
  }
  else {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar9;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
  }
  local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = plVar4[1];
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)&local_1a0,
             (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  if ((_Bit_iterator *)
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p !=
      &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish) {
    operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  p_Var19 = &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish;
  if (local_228 != &local_218) {
    operator_delete(local_228);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138);
  }
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  local_350 = &local_340;
  std::__cxx11::string::_M_construct((ulong)&local_350,'\x06');
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_350);
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_368 = *puVar17;
    lStack_360 = plVar4[3];
    local_378 = &local_368;
  }
  else {
    local_368 = *puVar17;
    local_378 = (ulong *)*plVar4;
  }
  local_370 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_378);
  plVar9 = plVar4 + 2;
  if ((_Bit_iterator *)*plVar4 == (_Bit_iterator *)plVar9) {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar9;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ = plVar4[3];
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)p_Var19;
  }
  else {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar9;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
  }
  local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = plVar4[1];
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)&local_1a0,
             (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  if ((_Bit_iterator *)
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != p_Var19) {
    operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350);
  }
  if ((char)local_140 == '\0') {
    for (uVar13 = 0;
        sVar6 = TreeDecomposition::numberOfRelations
                          ((local_358->_td).
                           super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        , uVar13 < sVar6; uVar13 = uVar13 + 1) {
      pTVar7 = TreeDecomposition::getRelation
                         ((local_358->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          uVar13);
      local_330 = &local_320;
      std::__cxx11::string::_M_construct((ulong)&local_330,'\x06');
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
      local_350 = &local_340;
      puVar17 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar17) {
        local_340 = *puVar17;
        lStack_338 = puVar5[3];
      }
      else {
        local_340 = *puVar17;
        local_350 = (ulong *)*puVar5;
      }
      local_348 = puVar5[1];
      *puVar5 = puVar17;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_350,(ulong)(pTVar7->_name)._M_dataplus._M_p);
      puVar17 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar17) {
        local_368 = *puVar17;
        lStack_360 = puVar5[3];
        local_378 = &local_368;
      }
      else {
        local_368 = *puVar17;
        local_378 = (ulong *)*puVar5;
      }
      local_370 = puVar5[1];
      *puVar5 = puVar17;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_378);
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p =
           (_Bit_type *)
           &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish;
      plVar4 = puVar5 + 2;
      if ((_Bit_iterator *)*puVar5 == (_Bit_iterator *)plVar4) {
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._8_8_ = puVar5[3];
      }
      else {
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)*puVar5;
      }
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._8_8_ = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)&local_1a0,
                 (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      if ((_Bit_iterator *)
          local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p !=
          &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish) {
        operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      if (local_378 != &local_368) {
        operator_delete(local_378);
      }
      if (local_350 != &local_340) {
        operator_delete(local_350);
      }
      if (local_330 != &local_320) {
        operator_delete(local_330);
      }
    }
  }
  else {
    for (uVar13 = 0;
        sVar6 = TreeDecomposition::numberOfRelations
                          ((local_358->_td).
                           super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        , uVar13 < sVar6; uVar13 = uVar13 + 1) {
      pTVar7 = TreeDecomposition::getRelation
                         ((local_358->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          uVar13);
      local_2c8 = &local_2b8;
      std::__cxx11::string::_M_construct((ulong)&local_2c8,'\x06');
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
      local_2e8 = &local_2d8;
      puVar17 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar17) {
        local_2d8 = *puVar17;
        lStack_2d0 = puVar5[3];
      }
      else {
        local_2d8 = *puVar17;
        local_2e8 = (ulong *)*puVar5;
      }
      local_2e0 = puVar5[1];
      *puVar5 = puVar17;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_2e8,(ulong)(pTVar7->_name)._M_dataplus._M_p);
      puVar17 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar17) {
        local_320 = *puVar17;
        uStack_318 = puVar5[3];
        local_330 = &local_320;
      }
      else {
        local_320 = *puVar17;
        local_330 = (ulong *)*puVar5;
      }
      local_328 = puVar5[1];
      *puVar5 = puVar17;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
      local_350 = &local_340;
      puVar17 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar17) {
        local_340 = *puVar17;
        lStack_338 = puVar5[3];
      }
      else {
        local_340 = *puVar17;
        local_350 = (ulong *)*puVar5;
      }
      local_348 = puVar5[1];
      *puVar5 = puVar17;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_350,(ulong)(pTVar7->_name)._M_dataplus._M_p);
      puVar17 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar17) {
        local_368 = *puVar17;
        lStack_360 = puVar5[3];
        local_378 = &local_368;
      }
      else {
        local_368 = *puVar17;
        local_378 = (ulong *)*puVar5;
      }
      local_370 = puVar5[1];
      *puVar5 = puVar17;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_378);
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p =
           (_Bit_type *)
           &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish;
      plVar4 = puVar5 + 2;
      if ((_Bit_iterator *)*puVar5 == (_Bit_iterator *)plVar4) {
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._8_8_ = puVar5[3];
      }
      else {
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)*puVar5;
      }
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._8_8_ = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)&local_1a0,
                 (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      if ((_Bit_iterator *)
          local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p !=
          &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish) {
        operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      if (local_378 != &local_368) {
        operator_delete(local_378);
      }
      if (local_350 != &local_340) {
        operator_delete(local_350);
      }
      if (local_330 != &local_320) {
        operator_delete(local_330);
      }
      if (local_2e8 != &local_2d8) {
        operator_delete(local_2e8);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8);
      }
    }
    for (uVar13 = 0;
        sVar6 = TreeDecomposition::numberOfRelations
                          ((local_358->_td).
                           super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        , uVar13 < sVar6; uVar13 = uVar13 + 1) {
      pTVar7 = TreeDecomposition::getRelation
                         ((local_358->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          uVar13);
      local_330 = &local_320;
      std::__cxx11::string::_M_construct((ulong)&local_330,'\x06');
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
      local_350 = &local_340;
      puVar17 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar17) {
        local_340 = *puVar17;
        lStack_338 = puVar5[3];
      }
      else {
        local_340 = *puVar17;
        local_350 = (ulong *)*puVar5;
      }
      local_348 = puVar5[1];
      *puVar5 = puVar17;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_350,(ulong)(pTVar7->_name)._M_dataplus._M_p);
      puVar17 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar17) {
        local_368 = *puVar17;
        lStack_360 = puVar5[3];
        local_378 = &local_368;
      }
      else {
        local_368 = *puVar17;
        local_378 = (ulong *)*puVar5;
      }
      local_370 = puVar5[1];
      *puVar5 = puVar17;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_378);
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p =
           (_Bit_type *)
           &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish;
      plVar4 = puVar5 + 2;
      if ((_Bit_iterator *)*puVar5 == (_Bit_iterator *)plVar4) {
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._8_8_ = puVar5[3];
      }
      else {
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)*puVar5;
      }
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._8_8_ = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)&local_1a0,
                 (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      if ((_Bit_iterator *)
          local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p !=
          &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish) {
        operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      if (local_378 != &local_368) {
        operator_delete(local_378);
      }
      if (local_350 != &local_340) {
        operator_delete(local_350);
      }
      if (local_330 != &local_320) {
        operator_delete(local_330);
      }
    }
  }
  local_1e0 = &local_1d0;
  std::__cxx11::string::_M_construct((ulong)&local_1e0,'\x06');
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_1e0,0,(char *)0x0,0x2b2de1);
  p_Var19 = &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish;
  local_200 = &local_1f0;
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_1f0 = *puVar17;
    lStack_1e8 = plVar4[3];
  }
  else {
    local_1f0 = *puVar17;
    local_200 = (ulong *)*plVar4;
  }
  local_1f8 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_200);
  local_1c0 = &local_1b0;
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_1b0 = *puVar17;
    lStack_1a8 = plVar4[3];
  }
  else {
    local_1b0 = *puVar17;
    local_1c0 = (ulong *)*plVar4;
  }
  local_1b8 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  local_228 = &local_218;
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_218 = *puVar17;
    lStack_210 = plVar4[3];
  }
  else {
    local_218 = *puVar17;
    local_228 = (ulong *)*plVar4;
  }
  local_220 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_160 = &local_150;
  std::__cxx11::string::_M_construct((ulong)&local_160,'\x06');
  uVar13 = 0xf;
  if (local_228 != &local_218) {
    uVar13 = local_218;
  }
  if (uVar13 < (ulong)(local_158 + local_220)) {
    uVar13 = 0xf;
    if (local_160 != &local_150) {
      uVar13 = local_150;
    }
    if (uVar13 < (ulong)(local_158 + local_220)) goto LAB_00226071;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_160,0,(char *)0x0,(ulong)local_228);
  }
  else {
LAB_00226071:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_160);
  }
  local_248 = &local_238;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_238 = *plVar4;
    lStack_230 = puVar5[3];
  }
  else {
    local_238 = *plVar4;
    local_248 = (long *)*puVar5;
  }
  local_240 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_248);
  local_268 = &local_258;
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_258 = *puVar17;
    lStack_250 = plVar4[3];
  }
  else {
    local_258 = *puVar17;
    local_268 = (ulong *)*plVar4;
  }
  local_260 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_268);
  local_2a8 = &local_298;
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_298 = *puVar17;
    lStack_290 = plVar4[3];
  }
  else {
    local_298 = *puVar17;
    local_2a8 = (ulong *)*plVar4;
  }
  local_2a0 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_180 = &local_170;
  std::__cxx11::string::_M_construct((ulong)&local_180,'\x06');
  uVar13 = 0xf;
  if (local_2a8 != &local_298) {
    uVar13 = local_298;
  }
  if (uVar13 < (ulong)(local_178 + local_2a0)) {
    uVar13 = 0xf;
    if (local_180 != &local_170) {
      uVar13 = local_170;
    }
    if (uVar13 < (ulong)(local_178 + local_2a0)) goto LAB_0022623f;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_180,0,(char *)0x0,(ulong)local_2a8);
  }
  else {
LAB_0022623f:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_180);
  }
  local_288 = &local_278;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_278 = *puVar1;
    uStack_270 = puVar5[3];
  }
  else {
    local_278 = *puVar1;
    local_288 = (undefined8 *)*puVar5;
  }
  local_280 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_288);
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_2b8 = *puVar17;
    lStack_2b0 = plVar4[3];
    local_2c8 = &local_2b8;
  }
  else {
    local_2b8 = *puVar17;
    local_2c8 = (ulong *)*plVar4;
  }
  local_2c0 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
  puVar17 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar17) {
    local_2d8 = *puVar17;
    lStack_2d0 = puVar5[3];
    local_2e8 = &local_2d8;
  }
  else {
    local_2d8 = *puVar17;
    local_2e8 = (ulong *)*puVar5;
  }
  local_2e0 = puVar5[1];
  *puVar5 = puVar17;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  local_138 = &local_128;
  std::__cxx11::string::_M_construct((ulong)&local_138,'\x06');
  uVar13 = 0xf;
  if (local_2e8 != &local_2d8) {
    uVar13 = local_2d8;
  }
  if (uVar13 < (ulong)(local_130 + local_2e0)) {
    uVar13 = 0xf;
    if (local_138 != &local_128) {
      uVar13 = local_128;
    }
    if (uVar13 < (ulong)(local_130 + local_2e0)) goto LAB_002263f9;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_2e8);
  }
  else {
LAB_002263f9:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_138);
  }
  puVar17 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar17) {
    local_320 = *puVar17;
    uStack_318 = puVar5[3];
    local_330 = &local_320;
  }
  else {
    local_320 = *puVar17;
    local_330 = (ulong *)*puVar5;
  }
  local_328 = puVar5[1];
  *puVar5 = puVar17;
  puVar5[1] = 0;
  *(undefined1 *)puVar17 = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
  puVar17 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar17) {
    local_340 = *puVar17;
    lStack_338 = puVar5[3];
    local_350 = &local_340;
  }
  else {
    local_340 = *puVar17;
    local_350 = (ulong *)*puVar5;
  }
  local_348 = puVar5[1];
  *puVar5 = puVar17;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  local_118 = local_108;
  std::__cxx11::string::_M_construct((ulong)&local_118,'\x06');
  uVar13 = 0xf;
  if (local_350 != &local_340) {
    uVar13 = local_340;
  }
  if (uVar13 < (ulong)(local_110 + local_348)) {
    uVar13 = 0xf;
    if (local_118 != local_108) {
      uVar13 = local_108[0];
    }
    if (uVar13 < (ulong)(local_110 + local_348)) goto LAB_00226527;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_350);
  }
  else {
LAB_00226527:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_350,(ulong)local_118);
  }
  puVar17 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar17) {
    local_368 = *puVar17;
    lStack_360 = puVar5[3];
    local_378 = &local_368;
  }
  else {
    local_368 = *puVar17;
    local_378 = (ulong *)*puVar5;
  }
  local_370 = puVar5[1];
  *puVar5 = puVar17;
  puVar5[1] = 0;
  *(undefined1 *)puVar17 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_378);
  plVar9 = plVar4 + 2;
  if ((_Bit_iterator *)*plVar4 == (_Bit_iterator *)plVar9) {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar9;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ = plVar4[3];
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)p_Var19;
  }
  else {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar9;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
  }
  local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = plVar4[1];
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)&local_1a0,
             (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  if ((_Bit_iterator *)
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != p_Var19) {
    operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378);
  }
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0);
  }
  local_350 = &local_340;
  std::__cxx11::string::_M_construct((ulong)&local_350,'\x06');
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_350);
  puVar17 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar17) {
    local_368 = *puVar17;
    lStack_360 = puVar5[3];
    local_378 = &local_368;
  }
  else {
    local_368 = *puVar17;
    local_378 = (ulong *)*puVar5;
  }
  local_370 = puVar5[1];
  *puVar5 = puVar17;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_378);
  plVar9 = plVar4 + 2;
  if ((_Bit_iterator *)*plVar4 == (_Bit_iterator *)plVar9) {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar9;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ = plVar4[3];
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)p_Var19;
  }
  else {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar9;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
  }
  local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = plVar4[1];
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)&local_1a0,
             (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  if ((_Bit_iterator *)
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != p_Var19) {
    operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350);
  }
  pCVar16 = local_358;
  if ((char)local_140 == '\0') {
    if ((local_358->viewGroups).
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (local_358->viewGroups).
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = 0;
      do {
        local_330 = &local_320;
        std::__cxx11::string::_M_construct((ulong)&local_330,'\x06');
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
        local_350 = &local_340;
        puVar17 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar17) {
          local_340 = *puVar17;
          lStack_338 = puVar5[3];
        }
        else {
          local_340 = *puVar17;
          local_350 = (ulong *)*puVar5;
        }
        local_348 = puVar5[1];
        *puVar5 = puVar17;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        cVar15 = '\x01';
        if (9 < uVar13) {
          uVar8 = uVar13;
          cVar3 = '\x04';
          do {
            cVar15 = cVar3;
            if (uVar8 < 100) {
              cVar15 = cVar15 + -2;
              goto LAB_002275ac;
            }
            if (uVar8 < 1000) {
              cVar15 = cVar15 + -1;
              goto LAB_002275ac;
            }
            if (uVar8 < 10000) goto LAB_002275ac;
            bVar2 = 99999 < uVar8;
            uVar8 = uVar8 / 10000;
            cVar3 = cVar15 + '\x04';
          } while (bVar2);
          cVar15 = cVar15 + '\x01';
        }
LAB_002275ac:
        local_2e8 = &local_2d8;
        std::__cxx11::string::_M_construct((ulong)&local_2e8,cVar15);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2e8,(uint)local_2e0,uVar13);
        uVar8 = 0xf;
        if (local_350 != &local_340) {
          uVar8 = local_340;
        }
        if (uVar8 < (ulong)(local_2e0 + local_348)) {
          uVar8 = 0xf;
          if (local_2e8 != &local_2d8) {
            uVar8 = local_2d8;
          }
          if (uVar8 < (ulong)(local_2e0 + local_348)) goto LAB_00227632;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,(ulong)local_350);
        }
        else {
LAB_00227632:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_350,(ulong)local_2e8);
        }
        local_378 = &local_368;
        puVar17 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar17) {
          local_368 = *puVar17;
          lStack_360 = puVar5[3];
        }
        else {
          local_368 = *puVar17;
          local_378 = (ulong *)*puVar5;
        }
        local_370 = puVar5[1];
        *puVar5 = puVar17;
        puVar5[1] = 0;
        *(undefined1 *)puVar17 = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_378);
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p =
             (_Bit_type *)
             &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish;
        plVar4 = puVar5 + 2;
        if ((_Bit_iterator *)*puVar5 == (_Bit_iterator *)plVar4) {
          local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
          local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._8_8_ = puVar5[3];
        }
        else {
          local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
          local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)*puVar5;
        }
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._8_8_ = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)&local_1a0,
                   (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        if ((_Bit_iterator *)
            local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p !=
            &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish) {
          operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        }
        if (local_378 != &local_368) {
          operator_delete(local_378);
        }
        if (local_2e8 != &local_2d8) {
          operator_delete(local_2e8);
        }
        if (local_350 != &local_340) {
          operator_delete(local_350);
        }
        if (local_330 != &local_320) {
          operator_delete(local_330);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < (ulong)(((long)(local_358->viewGroups).
                                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(local_358->viewGroups).
                                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
  }
  else {
    local_378 = (ulong *)((ulong)local_378 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_310,
               ((long)(local_358->viewGroups).
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_358->viewGroups).
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
               (bool *)&local_378,(allocator_type *)&local_350);
    if ((pCVar16->viewGroups).
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pCVar16->viewGroups).
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = 0;
      do {
        puVar20 = pCVar16->groupIncomingViews[uVar13].
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar12 = pCVar16->groupIncomingViews[uVar13].
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        local_208 = uVar13;
        local_140 = puVar12;
        if (puVar20 != puVar12) {
          do {
            uVar13 = pCVar16->viewToGroupMapping[*puVar20];
            uVar8 = uVar13 + 0x3f;
            if (-1 < (long)uVar13) {
              uVar8 = uVar13;
            }
            uVar14 = (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001);
            if ((*(ulong *)((long)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           (((long)uVar8 >> 6) + (uVar14 - 1)) * 8) >> (uVar13 & 0x3f) & 1) == 0) {
              local_2e8 = &local_2d8;
              std::__cxx11::string::_M_construct((ulong)&local_2e8,'\x06');
              puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e8);
              local_330 = &local_320;
              puVar17 = puVar5 + 2;
              if ((ulong *)*puVar5 == puVar17) {
                local_320 = *puVar17;
                uStack_318 = puVar5[3];
              }
              else {
                local_320 = *puVar17;
                local_330 = (ulong *)*puVar5;
              }
              local_328 = puVar5[1];
              *puVar5 = puVar17;
              puVar5[1] = 0;
              *(undefined1 *)(puVar5 + 2) = 0;
              cVar15 = '\x01';
              if (9 < uVar13) {
                uVar10 = uVar13;
                cVar3 = '\x04';
                do {
                  cVar15 = cVar3;
                  if (uVar10 < 100) {
                    cVar15 = cVar15 + -2;
                    goto LAB_00226a4d;
                  }
                  if (uVar10 < 1000) {
                    cVar15 = cVar15 + -1;
                    goto LAB_00226a4d;
                  }
                  if (uVar10 < 10000) goto LAB_00226a4d;
                  bVar2 = 99999 < uVar10;
                  uVar10 = uVar10 / 10000;
                  cVar3 = cVar15 + '\x04';
                } while (bVar2);
                cVar15 = cVar15 + '\x01';
              }
LAB_00226a4d:
              local_2c8 = &local_2b8;
              std::__cxx11::string::_M_construct((ulong)&local_2c8,cVar15);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        ((char *)local_2c8,(uint)local_2c0,uVar13);
              uVar10 = 0xf;
              if (local_330 != &local_320) {
                uVar10 = local_320;
              }
              if (uVar10 < (ulong)(local_2c0 + local_328)) {
                uVar10 = 0xf;
                if (local_2c8 != &local_2b8) {
                  uVar10 = local_2b8;
                }
                if (uVar10 < (ulong)(local_2c0 + local_328)) goto LAB_00226add;
                puVar5 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_2c8,0,(char *)0x0,(ulong)local_330);
              }
              else {
LAB_00226add:
                puVar5 = (undefined8 *)
                         std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_2c8);
              }
              puVar17 = puVar5 + 2;
              if ((ulong *)*puVar5 == puVar17) {
                local_340 = *puVar17;
                lStack_338 = puVar5[3];
                local_350 = &local_340;
              }
              else {
                local_340 = *puVar17;
                local_350 = (ulong *)*puVar5;
              }
              local_348 = puVar5[1];
              *puVar5 = puVar17;
              puVar5[1] = 0;
              *(undefined1 *)puVar17 = 0;
              puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_350);
              local_378 = &local_368;
              puVar17 = puVar5 + 2;
              if ((ulong *)*puVar5 == puVar17) {
                local_368 = *puVar17;
                lStack_360 = puVar5[3];
              }
              else {
                local_368 = *puVar17;
                local_378 = (ulong *)*puVar5;
              }
              local_370 = puVar5[1];
              *puVar5 = puVar17;
              puVar5[1] = 0;
              *(undefined1 *)(puVar5 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_378);
              if (local_378 != &local_368) {
                operator_delete(local_378);
              }
              if (local_350 != &local_340) {
                operator_delete(local_350);
              }
              if (local_2c8 != &local_2b8) {
                operator_delete(local_2c8);
              }
              if (local_330 != &local_320) {
                operator_delete(local_330);
              }
              if (local_2e8 != &local_2d8) {
                operator_delete(local_2e8);
              }
              puVar17 = (ulong *)((long)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl
                                        .super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                        _M_p + (((long)uVar8 >> 6) + (uVar14 - 1)) * 8);
              *puVar17 = *puVar17 | 1L << ((byte)uVar13 & 0x3f);
              puVar12 = local_140;
              pCVar16 = local_358;
            }
            puVar20 = puVar20 + 1;
          } while (puVar20 != puVar12);
        }
        local_288 = &local_278;
        std::__cxx11::string::_M_construct((ulong)&local_288,'\x06');
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_288);
        puVar17 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar17) {
          local_2b8 = *puVar17;
          lStack_2b0 = puVar5[3];
          local_2c8 = &local_2b8;
        }
        else {
          local_2b8 = *puVar17;
          local_2c8 = (ulong *)*puVar5;
        }
        local_2c0 = puVar5[1];
        *puVar5 = puVar17;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        cVar15 = '\x01';
        if (9 < local_208) {
          uVar13 = local_208;
          cVar3 = '\x04';
          do {
            cVar15 = cVar3;
            if (uVar13 < 100) {
              cVar15 = cVar15 + -2;
              goto LAB_00226d64;
            }
            if (uVar13 < 1000) {
              cVar15 = cVar15 + -1;
              goto LAB_00226d64;
            }
            if (uVar13 < 10000) goto LAB_00226d64;
            bVar2 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar3 = cVar15 + '\x04';
          } while (bVar2);
          cVar15 = cVar15 + '\x01';
        }
LAB_00226d64:
        local_2a8 = &local_298;
        std::__cxx11::string::_M_construct((ulong)&local_2a8,cVar15);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_2a8,(uint)local_2a0,local_208);
        uVar13 = 0xf;
        if (local_2c8 != &local_2b8) {
          uVar13 = local_2b8;
        }
        if (uVar13 < (ulong)(local_2a0 + local_2c0)) {
          uVar13 = 0xf;
          if (local_2a8 != &local_298) {
            uVar13 = local_298;
          }
          if (uVar13 < (ulong)(local_2a0 + local_2c0)) goto LAB_00226df8;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2a8,0,(char *)0x0,(ulong)local_2c8);
        }
        else {
LAB_00226df8:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_2a8);
        }
        puVar17 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar17) {
          local_2d8 = *puVar17;
          lStack_2d0 = puVar5[3];
          local_2e8 = &local_2d8;
        }
        else {
          local_2d8 = *puVar17;
          local_2e8 = (ulong *)*puVar5;
        }
        local_2e0 = puVar5[1];
        *puVar5 = puVar17;
        puVar5[1] = 0;
        *(undefined1 *)puVar17 = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e8);
        puVar17 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar17) {
          local_320 = *puVar17;
          uStack_318 = puVar5[3];
          local_330 = &local_320;
        }
        else {
          local_320 = *puVar17;
          local_330 = (ulong *)*puVar5;
        }
        local_328 = puVar5[1];
        *puVar5 = puVar17;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        cVar15 = '\x01';
        if (9 < local_208) {
          uVar13 = local_208;
          cVar3 = '\x04';
          do {
            cVar15 = cVar3;
            if (uVar13 < 100) {
              cVar15 = cVar15 + -2;
              goto LAB_00226f29;
            }
            if (uVar13 < 1000) {
              cVar15 = cVar15 + -1;
              goto LAB_00226f29;
            }
            if (uVar13 < 10000) goto LAB_00226f29;
            bVar2 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar3 = cVar15 + '\x04';
          } while (bVar2);
          cVar15 = cVar15 + '\x01';
        }
LAB_00226f29:
        local_268 = &local_258;
        std::__cxx11::string::_M_construct((ulong)&local_268,cVar15);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_268,(uint)local_260,local_208);
        uVar13 = 0xf;
        if (local_330 != &local_320) {
          uVar13 = local_320;
        }
        if (uVar13 < (ulong)(local_260 + local_328)) {
          uVar13 = 0xf;
          if (local_268 != &local_258) {
            uVar13 = local_258;
          }
          if (uVar13 < (ulong)(local_260 + local_328)) goto LAB_00226fa4;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_330);
        }
        else {
LAB_00226fa4:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_268);
        }
        puVar17 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar17) {
          local_340 = *puVar17;
          lStack_338 = puVar5[3];
          local_350 = &local_340;
        }
        else {
          local_340 = *puVar17;
          local_350 = (ulong *)*puVar5;
        }
        local_348 = puVar5[1];
        *puVar5 = puVar17;
        puVar5[1] = 0;
        *(undefined1 *)puVar17 = 0;
        puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_350);
        puVar17 = puVar5 + 2;
        if ((ulong *)*puVar5 == puVar17) {
          local_368 = *puVar17;
          lStack_360 = puVar5[3];
          local_378 = &local_368;
        }
        else {
          local_368 = *puVar17;
          local_378 = (ulong *)*puVar5;
        }
        local_370 = puVar5[1];
        *puVar5 = puVar17;
        puVar5[1] = 0;
        *(undefined1 *)(puVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_378);
        if (local_378 != &local_368) {
          operator_delete(local_378);
        }
        if (local_350 != &local_340) {
          operator_delete(local_350);
        }
        if (local_268 != &local_258) {
          operator_delete(local_268);
        }
        if (local_330 != &local_320) {
          operator_delete(local_330);
        }
        if (local_2e8 != &local_2d8) {
          operator_delete(local_2e8);
        }
        if (local_2a8 != &local_298) {
          operator_delete(local_2a8);
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8);
        }
        if (local_288 != &local_278) {
          operator_delete(local_288);
        }
        uVar13 = local_208 + 1;
        pCVar16 = local_358;
      } while (uVar13 < (ulong)(((long)(local_358->viewGroups).
                                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(local_358->viewGroups).
                                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
    if ((pCVar16->viewGroups).
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pCVar16->viewGroups).
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar13 = 0;
      do {
        uVar8 = uVar13 + 0x3f;
        if (-1 < (long)uVar13) {
          uVar8 = uVar13;
        }
        if ((*(ulong *)((long)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       (((long)uVar8 >> 6) +
                       ((ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) >>
             (uVar13 & 0x3f) & 1) == 0) {
          local_2e8 = &local_2d8;
          std::__cxx11::string::_M_construct((ulong)&local_2e8,'\x06');
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e8);
          local_330 = &local_320;
          puVar17 = puVar5 + 2;
          if ((ulong *)*puVar5 == puVar17) {
            local_320 = *puVar17;
            uStack_318 = puVar5[3];
          }
          else {
            local_320 = *puVar17;
            local_330 = (ulong *)*puVar5;
          }
          local_328 = puVar5[1];
          *puVar5 = puVar17;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          cVar15 = '\x01';
          if (9 < uVar13) {
            uVar8 = uVar13;
            cVar3 = '\x04';
            do {
              cVar15 = cVar3;
              if (uVar8 < 100) {
                cVar15 = cVar15 + -2;
                goto LAB_0022727d;
              }
              if (uVar8 < 1000) {
                cVar15 = cVar15 + -1;
                goto LAB_0022727d;
              }
              if (uVar8 < 10000) goto LAB_0022727d;
              bVar2 = 99999 < uVar8;
              uVar8 = uVar8 / 10000;
              cVar3 = cVar15 + '\x04';
            } while (bVar2);
            cVar15 = cVar15 + '\x01';
          }
LAB_0022727d:
          local_2c8 = &local_2b8;
          std::__cxx11::string::_M_construct((ulong)&local_2c8,cVar15);
          std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2c8,(uint)local_2c0,uVar13)
          ;
          uVar8 = 0xf;
          if (local_330 != &local_320) {
            uVar8 = local_320;
          }
          if (uVar8 < (ulong)(local_2c0 + local_328)) {
            uVar8 = 0xf;
            if (local_2c8 != &local_2b8) {
              uVar8 = local_2b8;
            }
            if (uVar8 < (ulong)(local_2c0 + local_328)) goto LAB_00227303;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,(ulong)local_330)
            ;
          }
          else {
LAB_00227303:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_2c8);
          }
          local_350 = &local_340;
          puVar17 = puVar5 + 2;
          if ((ulong *)*puVar5 == puVar17) {
            local_340 = *puVar17;
            lStack_338 = puVar5[3];
          }
          else {
            local_340 = *puVar17;
            local_350 = (ulong *)*puVar5;
          }
          local_348 = puVar5[1];
          *puVar5 = puVar17;
          puVar5[1] = 0;
          *(undefined1 *)puVar17 = 0;
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_350);
          puVar17 = puVar5 + 2;
          if ((ulong *)*puVar5 == puVar17) {
            local_368 = *puVar17;
            lStack_360 = puVar5[3];
            local_378 = &local_368;
          }
          else {
            local_368 = *puVar17;
            local_378 = (ulong *)*puVar5;
          }
          local_370 = puVar5[1];
          *puVar5 = puVar17;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_378);
          if (local_378 != &local_368) {
            operator_delete(local_378);
          }
          if (local_350 != &local_340) {
            operator_delete(local_350);
          }
          if (local_2c8 != &local_2b8) {
            operator_delete(local_2c8);
          }
          if (local_330 != &local_320) {
            operator_delete(local_330);
          }
          pCVar16 = local_358;
          if (local_2e8 != &local_2d8) {
            operator_delete(local_2e8);
            pCVar16 = local_358;
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < (ulong)(((long)(pCVar16->viewGroups).
                                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pCVar16->viewGroups).
                                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
    if ((_Bit_iterator *)
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_iterator *)0x0) {
      operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._8_8_ =
           local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ =
           local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
  }
  local_228 = &local_218;
  std::__cxx11::string::_M_construct((ulong)&local_228,'\x06');
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,0x2b2de1);
  local_248 = &local_238;
  plVar9 = plVar4 + 2;
  if ((long *)*plVar4 == plVar9) {
    local_238 = *plVar9;
    lStack_230 = plVar4[3];
  }
  else {
    local_238 = *plVar9;
    local_248 = (long *)*plVar4;
  }
  p_Var19 = &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish;
  local_240 = plVar4[1];
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_248);
  local_268 = &local_258;
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_258 = *puVar17;
    lStack_250 = plVar4[3];
  }
  else {
    local_258 = *puVar17;
    local_268 = (ulong *)*plVar4;
  }
  local_260 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_268);
  local_2a8 = &local_298;
  puVar17 = (ulong *)(plVar4 + 2);
  local_1c0 = &local_1b0;
  if ((ulong *)*plVar4 == puVar17) {
    local_298 = *puVar17;
    lStack_290 = plVar4[3];
  }
  else {
    local_298 = *puVar17;
    local_2a8 = (ulong *)*plVar4;
  }
  local_2a0 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_construct((ulong)&local_1c0,'\x06');
  uVar13 = 0xf;
  if (local_2a8 != &local_298) {
    uVar13 = local_298;
  }
  if (uVar13 < (ulong)(local_1b8 + local_2a0)) {
    uVar13 = 0xf;
    if (local_1c0 != &local_1b0) {
      uVar13 = local_1b0;
    }
    if (uVar13 < (ulong)(local_1b8 + local_2a0)) goto LAB_0022799d;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,(ulong)local_2a8);
  }
  else {
LAB_0022799d:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_1c0);
  }
  local_288 = &local_278;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_278 = *puVar1;
    uStack_270 = puVar5[3];
  }
  else {
    local_278 = *puVar1;
    local_288 = (undefined8 *)*puVar5;
  }
  local_280 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_288);
  local_2c8 = &local_2b8;
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_2b8 = *puVar17;
    lStack_2b0 = plVar4[3];
  }
  else {
    local_2b8 = *puVar17;
    local_2c8 = (ulong *)*plVar4;
  }
  local_2c0 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2c8);
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_2d8 = *puVar17;
    lStack_2d0 = plVar4[3];
    local_2e8 = &local_2d8;
  }
  else {
    local_2d8 = *puVar17;
    local_2e8 = (ulong *)*plVar4;
  }
  local_2e0 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_200 = &local_1f0;
  std::__cxx11::string::_M_construct((ulong)&local_200,'\x06');
  uVar13 = 0xf;
  if (local_2e8 != &local_2d8) {
    uVar13 = local_2d8;
  }
  if (uVar13 < (ulong)(local_1f8 + local_2e0)) {
    uVar13 = 0xf;
    if (local_200 != &local_1f0) {
      uVar13 = local_1f0;
    }
    if (uVar13 < (ulong)(local_1f8 + local_2e0)) goto LAB_00227b5d;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,(ulong)local_2e8);
  }
  else {
LAB_00227b5d:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_200);
  }
  puVar17 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar17) {
    local_320 = *puVar17;
    uStack_318 = puVar5[3];
    local_330 = &local_320;
  }
  else {
    local_320 = *puVar17;
    local_330 = (ulong *)*puVar5;
  }
  local_328 = puVar5[1];
  *puVar5 = puVar17;
  puVar5[1] = 0;
  *(undefined1 *)puVar17 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_330);
  puVar17 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar17) {
    local_340 = *puVar17;
    lStack_338 = plVar4[3];
    local_350 = &local_340;
  }
  else {
    local_340 = *puVar17;
    local_350 = (ulong *)*plVar4;
  }
  local_348 = plVar4[1];
  *plVar4 = (long)puVar17;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_1e0 = &local_1d0;
  std::__cxx11::string::_M_construct((ulong)&local_1e0,'\x06');
  uVar13 = 0xf;
  if (local_350 != &local_340) {
    uVar13 = local_340;
  }
  if (uVar13 < (ulong)(local_1d8 + local_348)) {
    uVar13 = 0xf;
    if (local_1e0 != &local_1d0) {
      uVar13 = local_1d0;
    }
    if (uVar13 < (ulong)(local_1d8 + local_348)) goto LAB_00227c7b;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1e0,0,(char *)0x0,(ulong)local_350);
  }
  else {
LAB_00227c7b:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_350,(ulong)local_1e0);
  }
  puVar17 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar17) {
    local_368 = *puVar17;
    lStack_360 = puVar5[3];
    local_378 = &local_368;
  }
  else {
    local_368 = *puVar17;
    local_378 = (ulong *)*puVar5;
  }
  local_370 = puVar5[1];
  *puVar5 = puVar17;
  puVar5[1] = 0;
  *(undefined1 *)puVar17 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_378);
  plVar9 = plVar4 + 2;
  if ((_Bit_iterator *)*plVar4 == (_Bit_iterator *)plVar9) {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar9;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ = plVar4[3];
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)p_Var19;
  }
  else {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar9;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
  }
  local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = plVar4[1];
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)&local_1a0,
             (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  if ((_Bit_iterator *)
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != p_Var19) {
    operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228);
  }
  local_378 = &local_368;
  std::__cxx11::string::_M_construct((ulong)&local_378,'\x06');
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_378);
  plVar9 = plVar4 + 2;
  if ((_Bit_iterator *)*plVar4 == (_Bit_iterator *)plVar9) {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar9;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ = plVar4[3];
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)p_Var19;
  }
  else {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar9;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
  }
  local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = plVar4[1];
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)&local_1a0,
             (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  if ((_Bit_iterator *)
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != p_Var19) {
    operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378);
  }
  lVar21 = 8;
  for (uVar13 = 0;
      sVar6 = QueryCompiler::numberOfViews
                        ((local_358->_qc).
                         super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr),
      uVar13 < sVar6; uVar13 = uVar13 + 1) {
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct((ulong)&local_2c8,'\x06');
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
    local_2e8 = &local_2d8;
    puVar17 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar17) {
      local_2d8 = *puVar17;
      lStack_2d0 = puVar5[3];
    }
    else {
      local_2d8 = *puVar17;
      local_2e8 = (ulong *)*puVar5;
    }
    local_2e0 = puVar5[1];
    *puVar5 = puVar17;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_2e8,*(ulong *)((long)local_358->viewName + lVar21 + -8));
    local_330 = &local_320;
    puVar17 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar17) {
      local_320 = *puVar17;
      uStack_318 = puVar5[3];
    }
    else {
      local_320 = *puVar17;
      local_330 = (ulong *)*puVar5;
    }
    local_328 = puVar5[1];
    *puVar5 = puVar17;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
    local_350 = &local_340;
    puVar17 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar17) {
      local_340 = *puVar17;
      lStack_338 = puVar5[3];
    }
    else {
      local_340 = *puVar17;
      local_350 = (ulong *)*puVar5;
    }
    local_348 = puVar5[1];
    *puVar5 = puVar17;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_350,*(ulong *)((long)local_358->viewName + lVar21 + -8));
    local_378 = &local_368;
    puVar17 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar17) {
      local_368 = *puVar17;
      lStack_360 = puVar5[3];
    }
    else {
      local_368 = *puVar17;
      local_378 = (ulong *)*puVar5;
    }
    local_370 = puVar5[1];
    *puVar5 = puVar17;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_378);
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish;
    plVar4 = puVar5 + 2;
    if ((_Bit_iterator *)*puVar5 == (_Bit_iterator *)plVar4) {
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ = puVar5[3];
    }
    else {
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)*puVar5;
    }
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)&local_1a0,
               (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    if ((_Bit_iterator *)
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p !=
        &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish) {
      operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378);
    }
    if (local_350 != &local_340) {
      operator_delete(local_350);
    }
    if (local_330 != &local_320) {
      operator_delete(local_330);
    }
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8);
    }
    lVar21 = lVar21 + 0x20;
  }
  if (local_358->_hasApplicationHandler == false) {
    local_330 = &local_320;
    std::__cxx11::string::_M_construct((ulong)&local_330,'\x06');
    psVar18 = local_f8;
    p_Var19 = &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_finish;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
    puVar17 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar17) {
      local_340 = *puVar17;
      lStack_338 = puVar5[3];
      local_350 = &local_340;
    }
    else {
      local_340 = *puVar17;
      local_350 = (ulong *)*puVar5;
    }
    local_348 = puVar5[1];
    *puVar5 = puVar17;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    local_2e8 = &local_2d8;
    std::__cxx11::string::_M_construct((ulong)&local_2e8,'\x06');
    uVar13 = 0xf;
    if (local_350 != &local_340) {
      uVar13 = local_340;
    }
    if (uVar13 < (ulong)(local_2e0 + local_348)) {
      uVar13 = 0xf;
      if (local_2e8 != &local_2d8) {
        uVar13 = local_2d8;
      }
      if (uVar13 < (ulong)(local_2e0 + local_348)) goto LAB_00228416;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,(ulong)local_350);
    }
    else {
LAB_00228416:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_350,(ulong)local_2e8);
    }
    puVar17 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar17) {
      local_368 = *puVar17;
      lStack_360 = puVar5[3];
      local_378 = &local_368;
    }
    else {
      local_368 = *puVar17;
      local_378 = (ulong *)*puVar5;
    }
    local_370 = puVar5[1];
    *puVar5 = puVar17;
    puVar5[1] = 0;
    *(undefined1 *)puVar17 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_378);
    plVar9 = plVar4 + 2;
    if ((_Bit_iterator *)*plVar4 == (_Bit_iterator *)plVar9) {
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar9;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ = plVar4[3];
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)p_Var19;
    }
    else {
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar9;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
    }
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ = plVar4[1];
    *plVar4 = (long)plVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)&local_1a0,
               (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    if ((_Bit_iterator *)
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != p_Var19) {
      operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378);
    }
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8);
    }
    if (local_350 != &local_340) {
      operator_delete(local_350);
    }
    puVar17 = local_330;
    if (local_330 == &local_320) goto LAB_00228719;
  }
  else {
    local_2e8 = &local_2d8;
    std::__cxx11::string::_M_construct((ulong)&local_2e8,'\x06');
    psVar18 = local_f8;
    p_Var19 = &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_finish;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e8);
    puVar17 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar17) {
      local_320 = *puVar17;
      uStack_318 = puVar5[3];
      local_330 = &local_320;
    }
    else {
      local_320 = *puVar17;
      local_330 = (ulong *)*puVar5;
    }
    local_328 = puVar5[1];
    *puVar5 = puVar17;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    local_2c8 = &local_2b8;
    std::__cxx11::string::_M_construct((ulong)&local_2c8,'\x06');
    uVar13 = 0xf;
    if (local_330 != &local_320) {
      uVar13 = local_320;
    }
    if (uVar13 < (ulong)(local_2c0 + local_328)) {
      uVar13 = 0xf;
      if (local_2c8 != &local_2b8) {
        uVar13 = local_2b8;
      }
      if (uVar13 < (ulong)(local_2c0 + local_328)) goto LAB_0022836c;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,(ulong)local_330);
    }
    else {
LAB_0022836c:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_2c8);
    }
    puVar17 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar17) {
      local_340 = *puVar17;
      lStack_338 = puVar5[3];
      local_350 = &local_340;
    }
    else {
      local_340 = *puVar17;
      local_350 = (ulong *)*puVar5;
    }
    local_348 = puVar5[1];
    *puVar5 = puVar17;
    puVar5[1] = 0;
    *(undefined1 *)puVar17 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_350);
    puVar17 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar17) {
      local_368 = *puVar17;
      lStack_360 = puVar5[3];
      local_378 = &local_368;
    }
    else {
      local_368 = *puVar17;
      local_378 = (ulong *)*puVar5;
    }
    local_370 = puVar5[1];
    *puVar5 = puVar17;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_378);
    plVar9 = plVar4 + 2;
    if ((_Bit_iterator *)*plVar4 == (_Bit_iterator *)plVar9) {
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar9;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ = plVar4[3];
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)p_Var19;
    }
    else {
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar9;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
    }
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ = plVar4[1];
    *plVar4 = (long)plVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)&local_1a0,
               (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    if ((_Bit_iterator *)
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != p_Var19) {
      operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    if (local_378 != &local_368) {
      operator_delete(local_378);
    }
    if (local_350 != &local_340) {
      operator_delete(local_350);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8);
    }
    if (local_330 != &local_320) {
      operator_delete(local_330);
    }
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8);
    }
    if (multifaq::cppgen::BENCH_INDIVIDUAL == '\x01') {
      local_378 = &local_368;
      std::__cxx11::string::_M_construct((ulong)&local_378,'\x06');
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_378);
      plVar4 = puVar5 + 2;
      if ((_Bit_iterator *)*puVar5 == (_Bit_iterator *)plVar4) {
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._8_8_ = puVar5[3];
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)p_Var19;
      }
      else {
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)*puVar5;
      }
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._8_8_ = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)&local_1a0,
                 (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      if ((_Bit_iterator *)
          local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != p_Var19) {
        operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      if (local_378 != &local_368) {
        operator_delete(local_378);
      }
    }
    local_378 = &local_368;
    std::__cxx11::string::_M_construct((ulong)&local_378,'\x06');
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_378);
    plVar4 = puVar5 + 2;
    if ((_Bit_iterator *)*puVar5 == (_Bit_iterator *)plVar4) {
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._8_8_ = puVar5[3];
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)p_Var19;
    }
    else {
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)*puVar5;
    }
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ = puVar5[1];
    *puVar5 = plVar4;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)&local_1a0,
               (ulong)local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    if ((_Bit_iterator *)
        local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != p_Var19) {
      operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    puVar17 = local_378;
    if (local_378 == &local_368) goto LAB_00228719;
  }
  operator_delete(puVar17);
LAB_00228719:
  p_Var19 = &local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish;
  local_378 = &local_368;
  std::__cxx11::string::_M_construct((ulong)&local_378,'\x03');
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_378,0,(char *)0x0,(ulong)local_1a0);
  plVar9 = plVar4 + 2;
  if ((_Bit_iterator *)*plVar4 == (_Bit_iterator *)plVar9) {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar9;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ = plVar4[3];
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)p_Var19;
  }
  else {
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar9;
    local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)*plVar4;
  }
  local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = plVar4[1];
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_310);
  (psVar18->_M_dataplus)._M_p = (pointer)&psVar18->field_2;
  psVar11 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar11) {
    lVar21 = plVar4[3];
    (psVar18->field_2)._M_allocated_capacity = *psVar11;
    *(long *)((long)&psVar18->field_2 + 8) = lVar21;
  }
  else {
    (psVar18->_M_dataplus)._M_p = (pointer)*plVar4;
    (psVar18->field_2)._M_allocated_capacity = *psVar11;
  }
  psVar18->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar11;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((_Bit_iterator *)
      local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != p_Var19) {
    operator_delete(local_310.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0);
  }
  return psVar18;
}

Assistant:

std::string CppGenerator::genRunFunction(bool parallelize)
{
    std::string returnString = offset(1)+"void run()\n"+
        offset(1)+"{\n";
    
    returnString += offset(2)+"int64_t startLoading = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count();\n\n"+
        offset(2)+"loadRelations();\n\n"+
        offset(2)+"int64_t loadTime = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count()-startLoading;\n"+
        offset(2)+"std::cout << \"Data loading: \"+"+
        "std::to_string(loadTime)+\"ms.\\n\";\n"+
        offset(2)+"std::ofstream ofs(\"times.txt\",std::ofstream::out | "+
        "std::ofstream::app);\n"+
        offset(2)+"ofs << loadTime;\n"+
        offset(2)+"ofs.close();\n\n";
    
    returnString += offset(2)+"int64_t startSorting = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count();\n\n";

    if (!parallelize)
    {
        for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
        {
            TDNode* node = _td->getRelation(rel);
            returnString += offset(2)+"sort"+node->_name+"();\n";
        }
    }
    else
    {
        for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
        {
            TDNode* node = _td->getRelation(rel);
            returnString += offset(2)+"std::thread sort"+node->_name+
                "Thread(sort"+node->_name+");\n";
        }

        for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
        {
            TDNode* node = _td->getRelation(rel);
            returnString += offset(2)+"sort"+node->_name+"Thread.join();\n";
        }
    }
    
    returnString += "\n"+offset(2)+"int64_t sortingTime = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count()-startSorting;\n"+
        offset(2)+"std::cout << \"Data sorting: \" + "+
        "std::to_string(sortingTime)+\"ms.\\n\";\n\n"+
        offset(2)+"ofs.open(\"times.txt\",std::ofstream::out | "+
        "std::ofstream::app);\n"+
        offset(2)+"ofs << \"\\t\" << sortingTime;\n"+
        offset(2)+"ofs.close();\n\n";

    returnString += offset(2)+"int64_t startProcess = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count();\n\n";

    if (!parallelize)
    {
        for (size_t group = 0; group < viewGroups.size(); ++group)
            returnString += offset(2)+"computeGroup"+std::to_string(group)+"();\n";
    }
    else
    {
        std::vector<bool> joinedGroups(viewGroups.size());
    
        for (size_t group = 0; group < viewGroups.size(); ++group)
        {
            for (const size_t& viewID : groupIncomingViews[group])
            {
                // find group that contains this view!
                size_t otherGroup = viewToGroupMapping[viewID];
                if (!joinedGroups[otherGroup])
                {
                    returnString += offset(2)+"group"+std::to_string(otherGroup)+
                        "Thread.join();\n";
                    joinedGroups[otherGroup] = 1;
                }
            }

            returnString += offset(2)+"std::thread group"+std::to_string(group)+
                    "Thread(computeGroup"+std::to_string(group)+");\n";            
        }

        for (size_t group = 0; group < viewGroups.size(); ++group)
        {
            if (!joinedGroups[group])
                returnString += offset(2)+"group"+std::to_string(group)+
                    "Thread.join();\n";
        }
    }
    
    returnString += "\n"+offset(2)+"int64_t processTime = duration_cast<milliseconds>("+
        "system_clock::now().time_since_epoch()).count()-startProcess;\n"+
        offset(2)+"std::cout << \"Data process: \"+"+
        "std::to_string(processTime)+\"ms.\\n\";\n"+
        offset(2)+"ofs.open(\"times.txt\",std::ofstream::out | std::ofstream::app);\n"+
        offset(2)+"ofs << \"\\t\" << processTime;\n";
    
    // if (BENCH_INDIVIDUAL)    
    returnString += offset(2)+"std::cout << \"Size of each computed View: \" << std::endl;\n";
    for (size_t view = 0; view < _qc->numberOfViews(); ++view)
    {
        returnString += offset(2)+"std::cout << \""+viewName[view]+": \" << "+
            viewName[view]+".size() << std::endl;\n";
    }
    
    if (_hasApplicationHandler)
    {
        returnString += offset(2)+"ofs.close();\n\n"+
            offset(2)+"int64_t appProcess = duration_cast<milliseconds>("+
            "system_clock::now().time_since_epoch()).count();\n\n";

        if (BENCH_INDIVIDUAL)
            returnString += offset(2)+"std::cout << \"run Application:\\n\";\n";

        returnString += offset(2)+"runApplication();\n"; 
    }
    else {        
        returnString += offset(2)+"ofs << std::endl;\n"+
            offset(2)+"ofs.close();\n\n";
    }
    
    return returnString+offset(1)+"}\n";
}